

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteBool(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,bool b)

{
  char *pcVar1;
  Stack<rapidjson::CrtAllocator> *this_00;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar2;
  char *pcVar3;
  undefined7 in_register_00000031;
  
  this_00 = &this->os_->stack_;
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    if (this_00->stackEnd_ < this_00->stackTop_ + 5) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,5);
    }
    pGVar2 = this->os_;
    pcVar3 = (pGVar2->stack_).stackTop_;
    pcVar1 = pcVar3 + 1;
    if ((pGVar2->stack_).stackEnd_ < pcVar1) goto LAB_004804b7;
    (pGVar2->stack_).stackTop_ = pcVar1;
    *pcVar3 = 'f';
    pGVar2 = this->os_;
    pcVar3 = (pGVar2->stack_).stackTop_;
    pcVar1 = pcVar3 + 1;
    if ((pGVar2->stack_).stackEnd_ < pcVar1) goto LAB_004804b7;
    (pGVar2->stack_).stackTop_ = pcVar1;
    *pcVar3 = 'a';
    pGVar2 = this->os_;
    pcVar3 = (pGVar2->stack_).stackTop_;
    pcVar1 = pcVar3 + 1;
    if ((pGVar2->stack_).stackEnd_ < pcVar1) goto LAB_004804b7;
    (pGVar2->stack_).stackTop_ = pcVar1;
    *pcVar3 = 'l';
    pGVar2 = this->os_;
    pcVar3 = (pGVar2->stack_).stackTop_;
    pcVar1 = pcVar3 + 1;
    if ((pGVar2->stack_).stackEnd_ < pcVar1) goto LAB_004804b7;
    (pGVar2->stack_).stackTop_ = pcVar1;
    *pcVar3 = 's';
  }
  else {
    if (this_00->stackEnd_ < this_00->stackTop_ + 4) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,4);
    }
    pGVar2 = this->os_;
    pcVar3 = (pGVar2->stack_).stackTop_;
    pcVar1 = pcVar3 + 1;
    if ((pGVar2->stack_).stackEnd_ < pcVar1) goto LAB_004804b7;
    (pGVar2->stack_).stackTop_ = pcVar1;
    *pcVar3 = 't';
    pGVar2 = this->os_;
    pcVar3 = (pGVar2->stack_).stackTop_;
    pcVar1 = pcVar3 + 1;
    if ((pGVar2->stack_).stackEnd_ < pcVar1) goto LAB_004804b7;
    (pGVar2->stack_).stackTop_ = pcVar1;
    *pcVar3 = 'r';
    pGVar2 = this->os_;
    pcVar3 = (pGVar2->stack_).stackTop_;
    pcVar1 = pcVar3 + 1;
    if ((pGVar2->stack_).stackEnd_ < pcVar1) goto LAB_004804b7;
    (pGVar2->stack_).stackTop_ = pcVar1;
    *pcVar3 = 'u';
  }
  pGVar2 = this->os_;
  pcVar3 = (pGVar2->stack_).stackTop_;
  pcVar1 = pcVar3 + 1;
  if (pcVar1 <= (pGVar2->stack_).stackEnd_) {
    (pGVar2->stack_).stackTop_ = pcVar1;
    *pcVar3 = 'e';
    return true;
  }
LAB_004804b7:
  __assert_fail("stackTop_ + sizeof(T) * count <= stackEnd_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/stack.h"
                ,0x81,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

bool WriteBool(bool b)  {
        if (b) {
            PutReserve(*os_, 4);
            PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'r'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'e');
        }
        else {
            PutReserve(*os_, 5);
            PutUnsafe(*os_, 'f'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 's'); PutUnsafe(*os_, 'e');
        }
        return true;
    }